

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int cert_stuff(Curl_easy *data,SSL_CTX *ctx,char *cert_file,curl_blob *cert_blob,char *cert_type,
              char *key_file,curl_blob *key_blob,char *key_type,char *key_passwd)

{
  bool bVar1;
  curl_blob *pcVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  BIO_METHOD *type;
  X509 *x_00;
  long lVar9;
  OPENSSL_STACK *pOVar10;
  OPENSSL_sk_freefunc p_Var11;
  UI_METHOD *method;
  UI_METHOD *pUVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EVP_PKEY *pEVar13;
  evp_pkey_st *peVar14;
  rsa_st *r;
  char *local_290;
  char *local_280;
  int local_270;
  char *local_250;
  char *local_210;
  int local_1fc;
  char *local_1f0;
  int local_1e0;
  RSA *rsa;
  int pktype;
  EVP_PKEY *priv_key_1;
  EVP_PKEY *pktmp;
  UI_METHOD *ui_method;
  EVP_PKEY *priv_key;
  X509 *x;
  stack_st_X509 *ca;
  EVP_PKEY *pri;
  PKCS12 *p12;
  BIO *cert_bio;
  anon_struct_16_2_531ec2c5 params;
  char *cmd_name;
  int cert_use_result;
  int cert_done;
  X509 *x509;
  SSL *ssl;
  int file_type;
  _Bool check_privkey;
  char error_buffer [256];
  char *local_40;
  char *key_file_local;
  char *cert_type_local;
  curl_blob *cert_blob_local;
  char *cert_file_local;
  SSL_CTX *ctx_local;
  Curl_easy *data_local;
  
  ssl._7_1_ = 1;
  ssl._0_4_ = do_file_type(cert_type);
  if (((cert_file == (char *)0x0) && (cert_blob == (curl_blob *)0x0)) && ((int)ssl != 0x2a)) {
    return 1;
  }
  bVar1 = false;
  if (key_passwd != (char *)0x0) {
    SSL_CTX_set_default_passwd_cb_userdata((SSL_CTX *)ctx,key_passwd);
    SSL_CTX_set_default_passwd_cb((SSL_CTX *)ctx,passwd_callback);
  }
  if ((int)ssl == 1) {
    if (cert_blob == (curl_blob *)0x0) {
      local_1e0 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)ctx,cert_file);
    }
    else {
      local_1e0 = SSL_CTX_use_certificate_chain_blob(ctx,cert_blob,key_passwd);
    }
    if (local_1e0 != 1) {
      local_1f0 = cert_file;
      if (cert_blob != (curl_blob *)0x0) {
        local_1f0 = "CURLOPT_SSLCERT_BLOB";
      }
      uVar7 = ERR_get_error();
      pcVar8 = ossl_strerror(uVar7,(char *)&file_type,0x100);
      Curl_failf(data,
                 "could not load PEM client certificate from %s, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                 ,local_1f0,pcVar8);
      return 0;
    }
  }
  else if ((int)ssl == 2) {
    if (cert_blob == (curl_blob *)0x0) {
      local_1fc = SSL_CTX_use_certificate_file((SSL_CTX *)ctx,cert_file,2);
    }
    else {
      local_1fc = SSL_CTX_use_certificate_blob(ctx,cert_blob,2,key_passwd);
    }
    if (local_1fc != 1) {
      local_210 = cert_file;
      if (cert_blob != (curl_blob *)0x0) {
        local_210 = "CURLOPT_SSLCERT_BLOB";
      }
      uVar7 = ERR_get_error();
      pcVar8 = ossl_strerror(uVar7,(char *)&file_type,0x100);
      Curl_failf(data,
                 "could not load ASN1 client certificate from %s, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                 ,local_210,pcVar8);
      return 0;
    }
  }
  else if ((int)ssl == 0x2a) {
    if ((((data->state).engine == (void *)0x0) && (_Var3 = is_pkcs11_uri(cert_file), _Var3)) &&
       (CVar5 = ossl_set_engine(data,"pkcs11"), CVar5 != CURLE_OK)) {
      return 0;
    }
    if ((data->state).engine == (void *)0x0) {
      Curl_failf(data,"crypto engine not set, can\'t load certificate");
      return 0;
    }
    params.cert = (X509 *)anon_var_dwarf_17bab7b;
    params.cert_id = (char *)0x0;
    cert_bio = (BIO *)cert_file;
    iVar4 = ENGINE_ctrl((ENGINE *)(data->state).engine,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
    if (iVar4 == 0) {
      Curl_failf(data,"ssl engine does not support loading certificates");
      return 0;
    }
    iVar4 = ENGINE_ctrl_cmd((ENGINE *)(data->state).engine,(char *)params.cert,0,&cert_bio,(f *)0x0,
                            1);
    if (iVar4 == 0) {
      uVar7 = ERR_get_error();
      pcVar8 = ossl_strerror(uVar7,(char *)&file_type,0x100);
      Curl_failf(data,"ssl engine cannot load client cert with id \'%s\' [%s]",cert_file,pcVar8);
      return 0;
    }
    if (params.cert_id == (char *)0x0) {
      Curl_failf(data,"ssl engine didn\'t initialized the certificate properly.");
      return 0;
    }
    iVar4 = SSL_CTX_use_certificate((SSL_CTX *)ctx,(X509 *)params.cert_id);
    if (iVar4 != 1) {
      uVar7 = ERR_get_error();
      pcVar8 = ossl_strerror(uVar7,(char *)&file_type,0x100);
      Curl_failf(data,"unable to set client certificate [%s]",pcVar8);
      return 0;
    }
    X509_free((X509 *)params.cert_id);
  }
  else {
    if ((int)ssl != 0x2b) {
      Curl_failf(data,"not supported file type \'%s\' for certificate",cert_type);
      return 0;
    }
    p12 = (PKCS12 *)0x0;
    pri = (EVP_PKEY *)0x0;
    x = (X509 *)0x0;
    if (cert_blob == (curl_blob *)0x0) {
      type = BIO_s_file();
      p12 = (PKCS12 *)BIO_new(type);
      if ((BIO *)p12 == (BIO *)0x0) {
        uVar7 = ERR_get_error();
        pcVar8 = ossl_strerror(uVar7,(char *)&file_type,0x100);
        Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",pcVar8);
        return 0;
      }
      lVar9 = BIO_ctrl((BIO *)p12,0x6c,3,cert_file);
      if ((int)lVar9 < 1) {
        Curl_failf(data,"could not open PKCS12 file \'%s\'",cert_file);
        BIO_free((BIO *)p12);
        return 0;
      }
    }
    else {
      p12 = (PKCS12 *)BIO_new_mem_buf(cert_blob->data,(int)cert_blob->len);
      if ((BIO *)p12 == (BIO *)0x0) {
        uVar7 = ERR_get_error();
        pcVar8 = ossl_strerror(uVar7,(char *)&file_type,0x100);
        Curl_failf(data,"BIO_new_mem_buf NULL, OpenSSL error %s",pcVar8);
        return 0;
      }
    }
    pri = (EVP_PKEY *)d2i_PKCS12_bio((BIO *)p12,(PKCS12 **)0x0);
    BIO_free((BIO *)p12);
    if (pri == (EVP_PKEY *)0x0) {
      local_250 = cert_file;
      if (cert_blob != (curl_blob *)0x0) {
        local_250 = "(memory blob)";
      }
      Curl_failf(data,"error reading PKCS12 file \'%s\'",local_250);
      return 0;
    }
    PKCS12_PBE_add();
    iVar4 = PKCS12_parse((PKCS12 *)pri,key_passwd,(EVP_PKEY **)&ca,(X509 **)&cert_use_result,
                         (stack_st_X509 **)&x);
    if (iVar4 == 0) {
      uVar7 = ERR_get_error();
      pcVar8 = ossl_strerror(uVar7,(char *)&file_type,0x100);
      Curl_failf(data,"could not parse PKCS12 file, check password, OpenSSL error %s",pcVar8);
      PKCS12_free((PKCS12 *)pri);
      return 0;
    }
    PKCS12_free((PKCS12 *)pri);
    iVar4 = SSL_CTX_use_certificate((SSL_CTX *)ctx,_cert_use_result);
    if (iVar4 == 1) {
      iVar4 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,(EVP_PKEY *)ca);
      if (iVar4 == 1) {
        iVar4 = SSL_CTX_check_private_key((SSL_CTX *)ctx);
        if (iVar4 == 0) {
          Curl_failf(data,
                     "private key from PKCS12 file \'%s\' does not match certificate in same file",
                     cert_file);
        }
        else if (x == (X509 *)0x0) {
LAB_00a417bf:
          bVar1 = true;
        }
        else {
          do {
            pOVar10 = ossl_check_const_X509_sk_type((stack_st_X509 *)x);
            iVar4 = OPENSSL_sk_num(pOVar10);
            if (iVar4 == 0) goto LAB_00a417bf;
            pOVar10 = ossl_check_X509_sk_type((stack_st_X509 *)x);
            x_00 = (X509 *)OPENSSL_sk_pop(pOVar10);
            iVar4 = SSL_CTX_add_client_CA((SSL_CTX *)ctx,x_00);
            if (iVar4 == 0) {
              X509_free(x_00);
              Curl_failf(data,"cannot add certificate to client CA list");
              goto LAB_00a417c9;
            }
            lVar9 = SSL_CTX_ctrl((SSL_CTX *)ctx,0xe,0,x_00);
          } while (lVar9 != 0);
          X509_free(x_00);
          Curl_failf(data,"cannot add certificate to certificate chain");
        }
      }
      else {
        Curl_failf(data,"unable to use private key from PKCS12 file \'%s\'",cert_file);
      }
    }
    else {
      uVar7 = ERR_get_error();
      pcVar8 = ossl_strerror(uVar7,(char *)&file_type,0x100);
      Curl_failf(data,"could not load PKCS12 client certificate, OpenSSL error %s",pcVar8);
    }
LAB_00a417c9:
    EVP_PKEY_free((EVP_PKEY *)ca);
    X509_free(_cert_use_result);
    pOVar10 = ossl_check_X509_sk_type((stack_st_X509 *)x);
    p_Var11 = ossl_check_X509_freefunc_type(X509_free);
    OPENSSL_sk_pop_free(pOVar10,p_Var11);
    if (!bVar1) {
      return 0;
    }
  }
  if ((key_file != (char *)0x0) ||
     (pcVar2 = cert_blob, local_40 = cert_file, key_blob != (curl_blob *)0x0)) {
    ssl._0_4_ = do_file_type(key_type);
    pcVar2 = key_blob;
    local_40 = key_file;
  }
  key_blob = pcVar2;
  if ((int)ssl == 1) {
    if (bVar1) goto LAB_00a41bdb;
  }
  else if ((int)ssl != 2) {
    if ((int)ssl == 0x2a) {
      if ((((data->state).engine == (void *)0x0) && (_Var3 = is_pkcs11_uri(local_40), _Var3)) &&
         (CVar5 = ossl_set_engine(data,"pkcs11"), CVar5 != CURLE_OK)) {
        return 0;
      }
      if ((data->state).engine == (void *)0x0) {
        Curl_failf(data,"crypto engine not set, can\'t load private key");
        return 0;
      }
      method = UI_create_method("curl user interface");
      if (method == (UI_METHOD *)0x0) {
        Curl_failf(data,"unable do create OpenSSL user-interface method");
        return 0;
      }
      pUVar12 = UI_OpenSSL();
      iVar4 = UI_method_get_opener((UI *)pUVar12);
      UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar4));
      pUVar12 = UI_OpenSSL();
      iVar4 = UI_method_get_closer((UI *)pUVar12);
      UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar4));
      UI_method_set_reader(method,ssl_ui_reader);
      UI_method_set_writer(method,ssl_ui_writer);
      pEVar13 = ENGINE_load_private_key((ENGINE *)(data->state).engine,local_40,method,key_passwd);
      UI_destroy_method(method);
      if (pEVar13 == (EVP_PKEY *)0x0) {
        Curl_failf(data,"failed to load private key from crypto engine");
        return 0;
      }
      iVar4 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,pEVar13);
      if (iVar4 != 1) {
        Curl_failf(data,"unable to set private key");
        EVP_PKEY_free(pEVar13);
        return 0;
      }
      EVP_PKEY_free(pEVar13);
    }
    else {
      if ((int)ssl != 0x2b) {
        Curl_failf(data,"not supported file type for private key");
        return 0;
      }
      if (!bVar1) {
        Curl_failf(data,"file type P12 for private key not supported");
        return 0;
      }
    }
    goto LAB_00a41bdb;
  }
  if (key_blob == (curl_blob *)0x0) {
    local_270 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)ctx,local_40,(int)ssl);
  }
  else {
    local_270 = SSL_CTX_use_PrivateKey_blob(ctx,key_blob,(int)ssl,key_passwd);
  }
  if (local_270 != 1) {
    if (local_40 == (char *)0x0) {
      local_280 = "(memory blob)";
    }
    else {
      local_280 = local_40;
    }
    if (key_type == (char *)0x0) {
      local_290 = "PEM";
    }
    else {
      local_290 = key_type;
    }
    Curl_failf(data,"unable to set private key file: \'%s\' type %s",local_280,local_290);
    return 0;
  }
LAB_00a41bdb:
  x509 = (X509 *)SSL_new((SSL_CTX *)ctx);
  if ((SSL *)x509 == (SSL *)0x0) {
    Curl_failf(data,"unable to create an SSL structure");
    return 0;
  }
  _cert_use_result = SSL_get_certificate((SSL *)x509);
  if (_cert_use_result != (X509 *)0x0) {
    pEVar13 = X509_get_pubkey(_cert_use_result);
    peVar14 = SSL_get_privatekey((SSL *)x509);
    EVP_PKEY_copy_parameters(pEVar13,peVar14);
    EVP_PKEY_free(pEVar13);
  }
  peVar14 = SSL_get_privatekey((SSL *)x509);
  iVar4 = EVP_PKEY_get_id(peVar14);
  if (iVar4 == 6) {
    r = EVP_PKEY_get1_RSA(peVar14);
    uVar6 = RSA_flags(r);
    if ((uVar6 & 1) != 0) {
      ssl._7_1_ = 0;
    }
    RSA_free(r);
  }
  SSL_free((SSL *)x509);
  if (((ssl._7_1_ & 1) == 1) && (iVar4 = SSL_CTX_check_private_key((SSL_CTX *)ctx), iVar4 == 0)) {
    Curl_failf(data,"Private key does not match the certificate public key");
    return 0;
  }
  return 1;
}

Assistant:

static
int cert_stuff(struct Curl_easy *data,
               SSL_CTX* ctx,
               char *cert_file,
               const struct curl_blob *cert_blob,
               const char *cert_type,
               char *key_file,
               const struct curl_blob *key_blob,
               const char *key_type,
               char *key_passwd)
{
  char error_buffer[256];
  bool check_privkey = TRUE;

  int file_type = do_file_type(cert_type);

  if(cert_file || cert_blob || (file_type == SSL_FILETYPE_ENGINE)) {
    SSL *ssl;
    X509 *x509;
    int cert_done = 0;
    int cert_use_result;

    if(key_passwd) {
      /* set the password in the callback userdata */
      SSL_CTX_set_default_passwd_cb_userdata(ctx, key_passwd);
      /* Set passwd callback: */
      SSL_CTX_set_default_passwd_cb(ctx, passwd_callback);
    }


    switch(file_type) {
    case SSL_FILETYPE_PEM:
      /* SSL_CTX_use_certificate_chain_file() only works on PEM files */
      cert_use_result = cert_blob ?
        SSL_CTX_use_certificate_chain_blob(ctx, cert_blob, key_passwd) :
        SSL_CTX_use_certificate_chain_file(ctx, cert_file);
      if(cert_use_result != 1) {
        failf(data,
              "could not load PEM client certificate from %s, " OSSL_PACKAGE
              " error %s, "
              "(no key found, wrong pass phrase, or wrong file format?)",
              (cert_blob ? "CURLOPT_SSLCERT_BLOB" : cert_file),
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        return 0;
      }
      break;

    case SSL_FILETYPE_ASN1:
      /* SSL_CTX_use_certificate_file() works with either PEM or ASN1, but
         we use the case above for PEM so this can only be performed with
         ASN1 files. */

      cert_use_result = cert_blob ?
        SSL_CTX_use_certificate_blob(ctx, cert_blob,
                                     file_type, key_passwd) :
        SSL_CTX_use_certificate_file(ctx, cert_file, file_type);
      if(cert_use_result != 1) {
        failf(data,
              "could not load ASN1 client certificate from %s, " OSSL_PACKAGE
              " error %s, "
              "(no key found, wrong pass phrase, or wrong file format?)",
              (cert_blob ? "CURLOPT_SSLCERT_BLOB" : cert_file),
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        return 0;
      }
      break;
    case SSL_FILETYPE_ENGINE:
#if defined(USE_OPENSSL_ENGINE) && defined(ENGINE_CTRL_GET_CMD_FROM_NAME)
      {
        /* Implicitly use pkcs11 engine if none was provided and the
         * cert_file is a PKCS#11 URI */
        if(!data->state.engine) {
          if(is_pkcs11_uri(cert_file)) {
            if(ossl_set_engine(data, "pkcs11") != CURLE_OK) {
              return 0;
            }
          }
        }

        if(data->state.engine) {
          const char *cmd_name = "LOAD_CERT_CTRL";
          struct {
            const char *cert_id;
            X509 *cert;
          } params;

          params.cert_id = cert_file;
          params.cert = NULL;

          /* Does the engine supports LOAD_CERT_CTRL ? */
          if(!ENGINE_ctrl(data->state.engine, ENGINE_CTRL_GET_CMD_FROM_NAME,
                          0, (void *)cmd_name, NULL)) {
            failf(data, "ssl engine does not support loading certificates");
            return 0;
          }

          /* Load the certificate from the engine */
          if(!ENGINE_ctrl_cmd(data->state.engine, cmd_name,
                              0, &params, NULL, 1)) {
            failf(data, "ssl engine cannot load client cert with id"
                  " '%s' [%s]", cert_file,
                  ossl_strerror(ERR_get_error(), error_buffer,
                                sizeof(error_buffer)));
            return 0;
          }

          if(!params.cert) {
            failf(data, "ssl engine didn't initialized the certificate "
                  "properly.");
            return 0;
          }

          if(SSL_CTX_use_certificate(ctx, params.cert) != 1) {
            failf(data, "unable to set client certificate [%s]",
                  ossl_strerror(ERR_get_error(), error_buffer,
                                sizeof(error_buffer)));
            return 0;
          }
          X509_free(params.cert); /* we don't need the handle any more... */
        }
        else {
          failf(data, "crypto engine not set, can't load certificate");
          return 0;
        }
      }
      break;
#else
      failf(data, "file type ENG for certificate not implemented");
      return 0;
#endif

    case SSL_FILETYPE_PKCS12:
    {
      BIO *cert_bio = NULL;
      PKCS12 *p12 = NULL;
      EVP_PKEY *pri;
      STACK_OF(X509) *ca = NULL;
      if(cert_blob) {
        cert_bio = BIO_new_mem_buf(cert_blob->data, (int)(cert_blob->len));
        if(!cert_bio) {
          failf(data,
                "BIO_new_mem_buf NULL, " OSSL_PACKAGE
                " error %s",
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)) );
          return 0;
        }
      }
      else {
        cert_bio = BIO_new(BIO_s_file());
        if(!cert_bio) {
          failf(data,
                "BIO_new return NULL, " OSSL_PACKAGE
                " error %s",
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)) );
          return 0;
        }

        if(BIO_read_filename(cert_bio, cert_file) <= 0) {
          failf(data, "could not open PKCS12 file '%s'", cert_file);
          BIO_free(cert_bio);
          return 0;
        }
      }

      p12 = d2i_PKCS12_bio(cert_bio, NULL);
      BIO_free(cert_bio);

      if(!p12) {
        failf(data, "error reading PKCS12 file '%s'",
              cert_blob ? "(memory blob)" : cert_file);
        return 0;
      }

      PKCS12_PBE_add();

      if(!PKCS12_parse(p12, key_passwd, &pri, &x509,
                       &ca)) {
        failf(data,
              "could not parse PKCS12 file, check password, " OSSL_PACKAGE
              " error %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        PKCS12_free(p12);
        return 0;
      }

      PKCS12_free(p12);

      if(SSL_CTX_use_certificate(ctx, x509) != 1) {
        failf(data,
              "could not load PKCS12 client certificate, " OSSL_PACKAGE
              " error %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        goto fail;
      }

      if(SSL_CTX_use_PrivateKey(ctx, pri) != 1) {
        failf(data, "unable to use private key from PKCS12 file '%s'",
              cert_file);
        goto fail;
      }

      if(!SSL_CTX_check_private_key (ctx)) {
        failf(data, "private key from PKCS12 file '%s' "
              "does not match certificate in same file", cert_file);
        goto fail;
      }
      /* Set Certificate Verification chain */
      if(ca) {
        while(sk_X509_num(ca)) {
          /*
           * Note that sk_X509_pop() is used below to make sure the cert is
           * removed from the stack properly before getting passed to
           * SSL_CTX_add_extra_chain_cert(), which takes ownership. Previously
           * we used sk_X509_value() instead, but then we'd clean it in the
           * subsequent sk_X509_pop_free() call.
           */
          X509 *x = sk_X509_pop(ca);
          if(!SSL_CTX_add_client_CA(ctx, x)) {
            X509_free(x);
            failf(data, "cannot add certificate to client CA list");
            goto fail;
          }
          if(!SSL_CTX_add_extra_chain_cert(ctx, x)) {
            X509_free(x);
            failf(data, "cannot add certificate to certificate chain");
            goto fail;
          }
        }
      }

      cert_done = 1;
  fail:
      EVP_PKEY_free(pri);
      X509_free(x509);
      sk_X509_pop_free(ca, X509_free);
      if(!cert_done)
        return 0; /* failure! */
      break;
    }
    default:
      failf(data, "not supported file type '%s' for certificate", cert_type);
      return 0;
    }

    if((!key_file) && (!key_blob)) {
      key_file = cert_file;
      key_blob = cert_blob;
    }
    else
      file_type = do_file_type(key_type);

    switch(file_type) {
    case SSL_FILETYPE_PEM:
      if(cert_done)
        break;
      /* FALLTHROUGH */
    case SSL_FILETYPE_ASN1:
      cert_use_result = key_blob ?
        SSL_CTX_use_PrivateKey_blob(ctx, key_blob, file_type, key_passwd) :
        SSL_CTX_use_PrivateKey_file(ctx, key_file, file_type);
      if(cert_use_result != 1) {
        failf(data, "unable to set private key file: '%s' type %s",
              key_file?key_file:"(memory blob)", key_type?key_type:"PEM");
        return 0;
      }
      break;
    case SSL_FILETYPE_ENGINE:
#ifdef USE_OPENSSL_ENGINE
      {                         /* XXXX still needs some work */
        EVP_PKEY *priv_key = NULL;

        /* Implicitly use pkcs11 engine if none was provided and the
         * key_file is a PKCS#11 URI */
        if(!data->state.engine) {
          if(is_pkcs11_uri(key_file)) {
            if(ossl_set_engine(data, "pkcs11") != CURLE_OK) {
              return 0;
            }
          }
        }

        if(data->state.engine) {
          UI_METHOD *ui_method =
            UI_create_method((char *)"curl user interface");
          if(!ui_method) {
            failf(data, "unable do create " OSSL_PACKAGE
                  " user-interface method");
            return 0;
          }
          UI_method_set_opener(ui_method, UI_method_get_opener(UI_OpenSSL()));
          UI_method_set_closer(ui_method, UI_method_get_closer(UI_OpenSSL()));
          UI_method_set_reader(ui_method, ssl_ui_reader);
          UI_method_set_writer(ui_method, ssl_ui_writer);
          /* the typecast below was added to please mingw32 */
          priv_key = (EVP_PKEY *)
            ENGINE_load_private_key(data->state.engine, key_file,
                                    ui_method,
                                    key_passwd);
          UI_destroy_method(ui_method);
          if(!priv_key) {
            failf(data, "failed to load private key from crypto engine");
            return 0;
          }
          if(SSL_CTX_use_PrivateKey(ctx, priv_key) != 1) {
            failf(data, "unable to set private key");
            EVP_PKEY_free(priv_key);
            return 0;
          }
          EVP_PKEY_free(priv_key);  /* we don't need the handle any more... */
        }
        else {
          failf(data, "crypto engine not set, can't load private key");
          return 0;
        }
      }
      break;
#else
      failf(data, "file type ENG for private key not supported");
      return 0;
#endif
    case SSL_FILETYPE_PKCS12:
      if(!cert_done) {
        failf(data, "file type P12 for private key not supported");
        return 0;
      }
      break;
    default:
      failf(data, "not supported file type for private key");
      return 0;
    }

    ssl = SSL_new(ctx);
    if(!ssl) {
      failf(data, "unable to create an SSL structure");
      return 0;
    }

    x509 = SSL_get_certificate(ssl);

    /* This version was provided by Evan Jordan and is supposed to not
       leak memory as the previous version: */
    if(x509) {
      EVP_PKEY *pktmp = X509_get_pubkey(x509);
      EVP_PKEY_copy_parameters(pktmp, SSL_get_privatekey(ssl));
      EVP_PKEY_free(pktmp);
    }

#if !defined(OPENSSL_NO_RSA) && !defined(OPENSSL_IS_BORINGSSL) && \
    !defined(OPENSSL_NO_DEPRECATED_3_0)
    {
      /* If RSA is used, don't check the private key if its flags indicate
       * it doesn't support it. */
      EVP_PKEY *priv_key = SSL_get_privatekey(ssl);
      int pktype;
#ifdef HAVE_OPAQUE_EVP_PKEY
      pktype = EVP_PKEY_id(priv_key);
#else
      pktype = priv_key->type;
#endif
      if(pktype == EVP_PKEY_RSA) {
        RSA *rsa = EVP_PKEY_get1_RSA(priv_key);
        if(RSA_flags(rsa) & RSA_METHOD_FLAG_NO_CHECK)
          check_privkey = FALSE;
        RSA_free(rsa); /* Decrement reference count */
      }
    }
#endif

    SSL_free(ssl);

    /* If we are using DSA, we can copy the parameters from
     * the private key */

    if(check_privkey == TRUE) {
      /* Now we know that a key and cert have been set against
       * the SSL context */
      if(!SSL_CTX_check_private_key(ctx)) {
        failf(data, "Private key does not match the certificate public key");
        return 0;
      }
    }
  }
  return 1;
}